

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O2

bool Search::array_contains<unsigned_int>(uint target,uint *A,size_t n)

{
  uint *puVar1;
  bool bVar2;
  size_t sVar3;
  
  if (A == (uint *)0x0) {
    return false;
  }
  sVar3 = 0;
  do {
    bVar2 = n != sVar3;
    if (n == sVar3) {
      return bVar2;
    }
    puVar1 = A + sVar3;
    sVar3 = sVar3 + 1;
  } while (*puVar1 != target);
  return bVar2;
}

Assistant:

bool array_contains(T target, const T* A, size_t n)
{
  if (A == nullptr)
    return false;
  for (size_t i = 0; i < n; i++)
    if (A[i] == target)
      return true;
  return false;
}